

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakeDirectoryCommand.h
# Opt level: O0

cmCommand * __thiscall cmMakeDirectoryCommand::Clone(cmMakeDirectoryCommand *this)

{
  cmCommand *this_00;
  cmMakeDirectoryCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmMakeDirectoryCommand((cmMakeDirectoryCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmMakeDirectoryCommand; }